

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O0

void __thiscall cpsm::Error::~Error(Error *this)

{
  Error *in_RDI;
  
  ~Error(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

Error() : msg_("(unknown error)") {}